

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

void __thiscall gvr::PLYWriter::writeListSize(PLYWriter *this,int v)

{
  PLYValue *pPVar1;
  undefined8 uVar2;
  uint in_ESI;
  long in_RDI;
  PLYWriter *in_stack_00000050;
  PLYWriter *in_stack_000000a0;
  
  if ((*(byte *)(in_RDI + 0x20) & 1) == 0) {
    writeHeader(in_stack_000000a0);
  }
  pPVar1 = nextValue(in_stack_00000050);
  uVar2 = std::ofstream::rdbuf();
  (*pPVar1->_vptr_PLYValue[8])(pPVar1,uVar2,(ulong)in_ESI);
  *(uint *)(in_RDI + 0x44) = in_ESI;
  return;
}

Assistant:

void PLYWriter::writeListSize(int v)
{
  if (!header_complete)
  {
    writeHeader();
  }

  nextValue().writeListSize(out.rdbuf(), v);

  plist=v;
}